

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::getInstanceDetails
          (BeagleCPUImpl<double,_1,_0> *this,BeagleInstanceDetails *returnInfo)

{
  undefined8 uVar1;
  undefined4 *in_RSI;
  long *in_RDI;
  
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = 0;
    uVar1 = (**(code **)(*in_RDI + 0x198))();
    *(undefined8 *)(in_RSI + 8) = uVar1;
    *(ulong *)(in_RSI + 8) = in_RDI[0xb] | *(ulong *)(in_RSI + 8);
    uVar1 = (**(code **)(*in_RDI + 400))();
    *(undefined8 *)(in_RSI + 4) = uVar1;
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getInstanceDetails(BeagleInstanceDetails* returnInfo) {
    if (returnInfo != NULL) {
        returnInfo->resourceNumber = 0;
        returnInfo->flags = getFlags();
        returnInfo->flags |= kFlags;

        returnInfo->implName = (char*) getName();
    }

    return BEAGLE_SUCCESS;
}